

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void fill_MPP_FMT_BGR555(RK_U8 *p,RK_U32 R,RK_U32 G,RK_U32 B,RK_U32 be)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  
  iVar3 = (G & 0xf8) << 2;
  bVar4 = (byte)(R >> 3) & 0x1f | (byte)iVar3;
  bVar1 = (byte)(((B & 0xf8) << 7) >> 8) | (byte)((uint)iVar3 >> 8);
  bVar2 = bVar1;
  if (be == 0) {
    bVar2 = bVar4;
    bVar4 = bVar1;
  }
  *p = bVar2;
  p[1] = bVar4;
  return;
}

Assistant:

static void fill_MPP_FMT_BGR555(RK_U8 *p, RK_U32 R, RK_U32 G, RK_U32 B, RK_U32 be)
{
    // MPP_FMT_BGR555 = ffmpeg: bgr555be
    // 16 bit pixel     MSB  -------->  LSB
    //                 (0bbb,bbgg,gggr,rrrr)
    // big    endian   |  byte 0 |  byte 1 |
    // little endian   |  byte 1 |  byte 0 |
    RK_U16 val = (((R >> 3) & 0x1f) <<  0) |
                 (((G >> 3) & 0x1f) <<  5) |
                 (((B >> 3) & 0x1f) << 10);
    if (be) {
        p[0] = (val >> 8) & 0xff;
        p[1] = (val >> 0) & 0xff;
    } else {
        p[0] = (val >> 0) & 0xff;
        p[1] = (val >> 8) & 0xff;
    }
}